

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.hpp
# Opt level: O0

void __thiscall
ylt::metric::metric_t::metric_t<3ul>
          (metric_t *this,MetricType type,string *name,string *help,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *labels_name)

{
  value_type *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  size_t i;
  undefined4 in_stack_ffffffffffffff84;
  string *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  MetricType type_00;
  ulong uVar1;
  metric_t *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  
  type_00 = (MetricType)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  std::__cxx11::string::string
            (in_stack_ffffffffffffffa0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff98);
  std::__cxx11::string::string
            (in_stack_ffffffffffffffa0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff98);
  metric_t(in_stack_ffffffffffffff98,type_00,in_stack_ffffffffffffff88,
           (string *)CONCAT44(in_stack_ffffffffffffff84,in_ESI));
  std::__cxx11::string::~string(in_RDX);
  std::__cxx11::string::~string(in_RDX);
  for (uVar1 = 0; uVar1 < 3; uVar1 = uVar1 + 1) {
    __x = (value_type *)(in_RDI + 0x80);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
    ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                  *)in_RDX,(size_type)__x);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_RDX,__x);
  }
  return;
}

Assistant:

metric_t(MetricType type, std::string name, std::string help,
           std::array<std::string, N> labels_name)
      : metric_t(type, std::move(name), std::move(help)) {
    for (size_t i = 0; i < N; i++) {
      labels_name_.push_back(std::move(labels_name[i]));
    }
  }